

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CodeSinkingPass::SinkInstruction(CodeSinkingPass *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  IRContext *this_00;
  undefined1 local_38 [16];
  Instruction *pos;
  BasicBlock *target_bb;
  Instruction *inst_local;
  CodeSinkingPass *this_local;
  
  target_bb = (BasicBlock *)inst;
  inst_local = (Instruction *)this;
  OVar2 = opt::Instruction::opcode(inst);
  if ((OVar2 != OpLoad) &&
     (OVar2 = opt::Instruction::opcode((Instruction *)target_bb), OVar2 != OpAccessChain)) {
    return false;
  }
  bVar1 = ReferencesMutableMemory(this,(Instruction *)target_bb);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pos = (Instruction *)FindNewBasicBlockFor(this,(Instruction *)target_bb);
    if ((BasicBlock *)pos == (BasicBlock *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      BasicBlock::begin((BasicBlock *)local_38);
      local_38._8_8_ =
           utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)local_38);
      while (OVar2 = opt::Instruction::opcode((Instruction *)local_38._8_8_), OVar2 == OpPhi) {
        local_38._8_8_ =
             utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                       ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_38._8_8_);
      }
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                ((IntrusiveNodeBase<spvtools::opt::Instruction> *)target_bb,
                 (Instruction *)local_38._8_8_);
      this_00 = Pass::context(&this->super_Pass);
      IRContext::set_instr_block(this_00,(Instruction *)target_bb,(BasicBlock *)pos);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CodeSinkingPass::SinkInstruction(Instruction* inst) {
  if (inst->opcode() != spv::Op::OpLoad &&
      inst->opcode() != spv::Op::OpAccessChain) {
    return false;
  }

  if (ReferencesMutableMemory(inst)) {
    return false;
  }

  if (BasicBlock* target_bb = FindNewBasicBlockFor(inst)) {
    Instruction* pos = &*target_bb->begin();
    while (pos->opcode() == spv::Op::OpPhi) {
      pos = pos->NextNode();
    }

    inst->InsertBefore(pos);
    context()->set_instr_block(inst, target_bb);
    return true;
  }
  return false;
}